

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mtmsr(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *pTVar2;
  ulong uVar3;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar4;
  TCGTemp *a3;
  ulong uVar5;
  uintptr_t o_1;
  TCGv_i64 ret;
  TCGTemp *ts;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->pr != true) {
    pTVar2 = ctx->uc->tcg_ctx;
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      pTVar4 = tcg_const_i32_ppc64(pTVar2,1);
      tcg_gen_op3_ppc64(pTVar2,INDEX_op_st_i32,(TCGArg)(pTVar4 + (long)pTVar2),
                        (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0xffffffffffffe3dc);
      tcg_temp_free_internal_ppc64(pTVar2,(TCGTemp *)(pTVar4 + (long)pTVar2));
    }
    uVar1 = ctx->opcode;
    a3 = tcg_temp_new_internal_ppc64(pTVar2,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)a3 - (long)pTVar2);
    if ((uVar1 >> 0x10 & 1) == 0) {
      uVar3 = (ctx->base).pc_next;
      tcg_ctx = ctx->uc->tcg_ctx;
      uVar5 = uVar3 & 0xffffffff;
      if (ctx->sf_mode != false) {
        uVar5 = uVar3;
      }
      tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(cpu_nip + (long)tcg_ctx),uVar5);
      tcg_gen_deposit_i64_ppc64
                (pTVar2,ret,cpu_msr,
                 *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0,0x20);
      local_48 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      ts = (TCGTemp *)(ret + (long)pTVar2);
      local_40 = ts;
      tcg_gen_callN_ppc64(pTVar2,helper_store_msr_ppc64,(TCGTemp *)0x0,2,&local_48);
    }
    else {
      ts = tcg_temp_new_internal_ppc64(pTVar2,TCG_TYPE_I64,false);
      tcg_gen_andi_i64_ppc64
                (pTVar2,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
                 0x8002);
      tcg_gen_andi_i64_ppc64(pTVar2,(TCGv_i64)((long)ts - (long)pTVar2),cpu_msr,-0x8003);
      tcg_gen_op3_ppc64(pTVar2,INDEX_op_or_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)a3);
      local_48 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      local_40 = ts;
      tcg_gen_callN_ppc64(pTVar2,helper_store_msr_ppc64,(TCGTemp *)0x0,2,&local_48);
      tcg_temp_free_internal_ppc64(pTVar2,(TCGTemp *)(ret + (long)pTVar2));
    }
    tcg_temp_free_internal_ppc64(pTVar2,ts);
    uVar3 = (ctx->base).pc_next;
    pTVar2 = ctx->uc->tcg_ctx;
    uVar5 = uVar3 & 0xffffffff;
    if (ctx->sf_mode != false) {
      uVar5 = uVar3;
    }
    tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i64,(TCGArg)(cpu_nip + (long)pTVar2),uVar5);
    ctx->exception = 0x200;
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_mtmsr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    if (ctx->opcode & 0x00010000) {
        /* L=1 form only updates EE and RI */
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)],
                        (1 << MSR_RI) | (1 << MSR_EE));
        tcg_gen_andi_tl(tcg_ctx, t1, cpu_msr,
                        ~(target_ulong)((1 << MSR_RI) | (1 << MSR_EE)));
        tcg_gen_or_tl(tcg_ctx, t1, t1, t0);

        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, t1);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);

    } else {
        TCGv msr = tcg_temp_new(tcg_ctx);

        /*
         * XXX: we need to update nip before the store if we enter
         *      power saving mode, we will exit the loop directly from
         *      ppc_store_msr
         */
        gen_update_nip(ctx, ctx->base.pc_next);
#if defined(TARGET_PPC64)
        tcg_gen_deposit_tl(tcg_ctx, msr, cpu_msr, cpu_gpr[rS(ctx->opcode)], 0, 32);
#else
        tcg_gen_mov_tl(tcg_ctx, msr, cpu_gpr[rS(ctx->opcode)]);
#endif
        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, msr);
        tcg_temp_free(tcg_ctx, msr);
    }
    /* Must stop the translation as machine state (may have) changed */
    gen_stop_exception(ctx);
}